

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

int gmatch_aux(lua_State *L)

{
  bool bVar1;
  ulong *puVar2;
  char *e;
  int iVar3;
  int unaff_EBP;
  char *s;
  
  puVar2 = (ulong *)lua_touserdata(L,-0xf462b);
  puVar2[6] = (ulong)L;
  s = (char *)*puVar2;
  iVar3 = 0;
  if (s <= (char *)puVar2[4]) {
    do {
      *(undefined1 *)((long)puVar2 + 0x3c) = 0;
      e = match((MatchState *)(puVar2 + 3),s,(char *)puVar2[1]);
      bVar1 = true;
      if ((e != (char *)0x0) && (e != (char *)puVar2[2])) {
        puVar2[2] = (ulong)e;
        *puVar2 = (ulong)e;
        unaff_EBP = push_captures((MatchState *)(puVar2 + 3),s,e);
        bVar1 = false;
      }
      iVar3 = unaff_EBP;
    } while ((bVar1) && (s = s + 1, iVar3 = 0, s <= (char *)puVar2[4]));
  }
  return iVar3;
}

Assistant:

static int gmatch_aux (lua_State *L) {
  GMatchState *gm = (GMatchState *)lua_touserdata(L, lua_upvalueindex(3));
  const char *src;
  gm->ms.L = L;
  for (src = gm->src; src <= gm->ms.src_end; src++) {
    const char *e;
    reprepstate(&gm->ms);
    if ((e = match(&gm->ms, src, gm->p)) != NULL && e != gm->lastmatch) {
      gm->src = gm->lastmatch = e;
      return push_captures(&gm->ms, src, e);
    }
  }
  return 0;  /* not found */
}